

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O2

void av1_lowbd_fwd_txfm2d_4x4_sse2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  code *pcVar1;
  code *pcVar2;
  uint uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  bool bVar6;
  int8_t *piVar7;
  int out_size;
  undefined7 in_register_00000009;
  __m128i *in;
  undefined1 auVar8 [16];
  undefined1 auVar12 [16];
  undefined1 auVar15 [16];
  __m128i buf1 [4];
  __m128i buf0 [4];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  piVar7 = av1_fwd_txfm_shift_ls[0];
  uVar3 = (uint)CONCAT71(in_register_00000009,tx_type);
  pcVar1 = *(code **)((long)col_txfm4x4_arr + (ulong)(uVar3 * 8));
  pcVar2 = *(code **)((long)row_txfm4x4_arr + (ulong)(uVar3 * 8));
  bVar6 = false;
  if (uVar3 < 0x10) {
    if ((0x4110U >> (uVar3 & 0x1f) & 1) != 0) {
      bVar6 = false;
LAB_00412cac:
      out_size = 4;
      load_buffer_16bit_to_16bit_w4_flip(input,stride,buf0,4);
      goto LAB_00412cbe;
    }
    if ((0x80a0U >> (uVar3 & 0x1f) & 1) == 0) {
      if (uVar3 == 6) {
        bVar6 = true;
        goto LAB_00412cac;
      }
    }
    else {
      bVar6 = true;
    }
  }
  out_size = 4;
  load_buffer_16bit_to_16bit_w4(input,stride,buf0,4);
LAB_00412cbe:
  in = buf0;
  round_shift_16bit(in,4,(int)*piVar7);
  (*pcVar1)(in,in,0xd);
  buf0[0]._0_12_ = buf0[0]._2_12_;
  buf0[2]._0_12_ = buf0[2]._2_12_;
  round_shift_16bit(in,4,(int)piVar7[1]);
  auVar11._12_2_ = buf0[0][0]._6_2_;
  auVar11._0_12_ = buf0[0]._0_12_;
  auVar11._14_2_ = buf0[1][0]._6_2_;
  auVar10._12_4_ = auVar11._12_4_;
  auVar10._0_10_ = buf0[0]._0_10_;
  auVar10._10_2_ = buf0[1][0]._4_2_;
  auVar9._10_6_ = auVar10._10_6_;
  auVar9._0_8_ = buf0[0][0];
  auVar9._8_2_ = buf0[0][0]._4_2_;
  auVar4._4_8_ = auVar9._8_8_;
  auVar4._2_2_ = buf0[1][0]._2_2_;
  auVar4._0_2_ = buf0[0][0]._2_2_;
  auVar8._0_4_ = CONCAT22((undefined2)buf0[1][0],(short)buf0[0][0]);
  auVar8._4_12_ = auVar4;
  auVar14._12_2_ = buf0[2][0]._6_2_;
  auVar14._0_12_ = buf0[2]._0_12_;
  auVar14._14_2_ = buf0[3][0]._6_2_;
  auVar13._12_4_ = auVar14._12_4_;
  auVar13._0_10_ = buf0[2]._0_10_;
  auVar13._10_2_ = buf0[3][0]._4_2_;
  auVar12._10_6_ = auVar13._10_6_;
  auVar12._0_8_ = buf0[2][0];
  auVar12._8_2_ = buf0[2][0]._4_2_;
  auVar5._4_8_ = auVar12._8_8_;
  auVar5._2_2_ = buf0[3][0]._2_2_;
  auVar5._0_2_ = buf0[2][0]._2_2_;
  auVar15._0_8_ = auVar8._0_8_;
  auVar15._8_4_ = auVar4._0_4_;
  auVar15._12_4_ = auVar5._0_4_;
  buf1[0][1] = auVar15._8_8_;
  buf1[0][0] = CONCAT44(CONCAT22((undefined2)buf0[3][0],(short)buf0[2][0]),auVar8._0_4_);
  buf1[1][1] = 0;
  buf1[2][0]._4_4_ = auVar12._8_4_;
  buf1[2][0]._0_4_ = auVar9._8_4_;
  buf1[2][1]._0_4_ = auVar10._12_4_;
  buf1[2][1]._4_4_ = auVar13._12_4_;
  buf1[3] = (__m128i)((undefined1  [16])buf1[2] >> 0x40);
  buf1[1][0] = buf1[0][1];
  if (bVar6) {
    flip_buf_sse2(buf1,in,4);
  }
  else {
    in = buf1;
  }
  (*pcVar2)(in,in,0xd);
  round_shift_16bit(in,4,(int)piVar7[2]);
  store_buffer_16bit_to_32bit_w4(in,output,4,out_size);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_4x4_sse2(const int16_t *input, int32_t *output,
                                   int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[4], buf1[4], *buf;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_4X4];
  const int txw_idx = get_txw_idx(TX_4X4);
  const int txh_idx = get_txh_idx(TX_4X4);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 4;
  const int height = 4;
  const transform_1d_sse2 col_txfm = col_txfm4x4_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm4x4_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  if (ud_flip) {
    load_buffer_16bit_to_16bit_w4_flip(input, stride, buf0, height);
  } else {
    load_buffer_16bit_to_16bit_w4(input, stride, buf0, height);
  }
  round_shift_16bit(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit(buf0, height, shift[1]);
  transpose_16bit_4x4(buf0, buf1);

  if (lr_flip) {
    buf = buf0;
    flip_buf_sse2(buf1, buf, width);
  } else {
    buf = buf1;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit(buf, width, shift[2]);
  store_buffer_16bit_to_32bit_w4(buf, output, height, width);
}